

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

float nk_panel_get_border(nk_style *style,nk_flags flags,nk_panel_type type)

{
  nk_panel_type type_local;
  nk_flags flags_local;
  nk_style *style_local;
  
  if ((flags & 1) == 0) {
    return 0.0;
  }
  if (type != NK_PANEL_WINDOW) {
    if (type == NK_PANEL_GROUP) {
      return (style->window).group_border;
    }
    if (type == NK_PANEL_POPUP) {
      return (style->window).popup_border;
    }
    if (type == NK_PANEL_CONTEXTUAL) {
      return (style->window).contextual_border;
    }
    if (type == NK_PANEL_COMBO) {
      return (style->window).combo_border;
    }
    if (type == NK_PANEL_MENU) {
      return (style->window).menu_border;
    }
    if (type == NK_PANEL_TOOLTIP) {
      return (style->window).menu_border;
    }
  }
  return (style->window).border;
}

Assistant:

NK_LIB float
nk_panel_get_border(const struct nk_style *style, nk_flags flags,
enum nk_panel_type type)
{
if (flags & NK_WINDOW_BORDER) {
switch (type) {
default:
case NK_PANEL_WINDOW: return style->window.border;
case NK_PANEL_GROUP: return style->window.group_border;
case NK_PANEL_POPUP: return style->window.popup_border;
case NK_PANEL_CONTEXTUAL: return style->window.contextual_border;
case NK_PANEL_COMBO: return style->window.combo_border;
case NK_PANEL_MENU: return style->window.menu_border;
case NK_PANEL_TOOLTIP: return style->window.menu_border;
}} else return 0;
}